

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

QSize __thiscall QProgressDialog::sizeHint(QProgressDialog *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QProgressDialogPrivate *pQVar4;
  QStyle *pQVar5;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int height;
  int marginRight;
  int marginLeft;
  int spacing;
  int marginBottom;
  QProgressDialogPrivate *d;
  QSize barSize;
  QSize labelSize;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QSize *in_stack_ffffffffffffff90;
  int local_30 [2];
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QProgressDialog *)0x7b1fea);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  if (pQVar4->label == (QLabel *)0x0) {
    QSize::QSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  else {
    local_18 = (undefined1 *)
               (**(code **)(*(long *)&(pQVar4->label->super_QFrame).super_QWidget + 0x70))();
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = (undefined1 *)(**(code **)(*(long *)&pQVar4->bar->super_QWidget + 0x70))();
  pQVar5 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x4e,0,in_RDI);
  pQVar5 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x50,0,in_RDI);
  pQVar5 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar1 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x4b,0,in_RDI);
  pQVar5 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar2 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x4d,0,in_RDI);
  QSize::height((QSize *)0x7b2100);
  QSize::height((QSize *)0x7b2116);
  if (pQVar4->cancel != (QPushButton *)0x0) {
    local_28 = (**(code **)(*(long *)&(pQVar4->cancel->super_QAbstractButton).super_QWidget + 0x70))
                         ();
    QSize::height((QSize *)0x7b2156);
  }
  local_30[1] = 200;
  iVar3 = QSize::width((QSize *)0x7b2174);
  local_30[0] = iVar3 + iVar1 + iVar2;
  qMax<int>(local_30 + 1,local_30);
  QSize::QSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QProgressDialog::sizeHint() const
{
    Q_D(const QProgressDialog);
    QSize labelSize = d->label ? d->label->sizeHint() : QSize(0, 0);
    QSize barSize = d->bar->sizeHint();
    int marginBottom = style()->pixelMetric(QStyle::PM_LayoutBottomMargin, 0, this);
    int spacing = style()->pixelMetric(QStyle::PM_LayoutVerticalSpacing, 0, this);
    int marginLeft = style()->pixelMetric(QStyle::PM_LayoutLeftMargin, 0, this);
    int marginRight = style()->pixelMetric(QStyle::PM_LayoutRightMargin, 0, this);

    int height = marginBottom * 2 + barSize.height() + labelSize.height() + spacing;
    if (d->cancel)
        height += d->cancel->sizeHint().height() + spacing;
    return QSize(qMax(200, labelSize.width() + marginLeft + marginRight), height);
}